

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  mapped_type mVar1;
  value_type vVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  reference pvVar7;
  size_type sVar8;
  pointer ppVar9;
  reference pvVar10;
  long in_RSI;
  int in_EDI;
  double dVar11;
  vector<double,_std::allocator<double>_> B_values_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_cols_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_rows_2;
  size_t i_8;
  size_t j_3;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  B_5;
  size_t i_7;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  B_4;
  size_t i_6;
  vector<double,_std::allocator<double>_> B_values_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_cols_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_rows_1;
  size_t i_5;
  size_t j_2;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  B_3;
  size_t i_4;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  B_2;
  size_t i_3;
  vector<double,_std::allocator<double>_> B_values;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_cols;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_rows;
  size_t i_2;
  size_t j_1;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  B_1;
  size_t i_1;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  B;
  size_t i;
  Timer timer;
  const_iterator it;
  size_t row_1;
  size_t index;
  vector<double,_std::allocator<double>_> A_csr_values;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_csr_cols;
  double value;
  uint col_idx;
  size_t j;
  size_t row;
  uint total_nnz;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_csr_rows;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  A_flatmap;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  A_map;
  vector<double,_std::allocator<double>_> exec_times;
  size_t nnz_per_row;
  size_t N;
  size_t runs;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *in_stack_fffffffffffffb48;
  flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void> *in_stack_fffffffffffffb50;
  allocator_type *in_stack_fffffffffffffb60;
  size_type in_stack_fffffffffffffb68;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *in_stack_fffffffffffffb70;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  *in_stack_fffffffffffffb78;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *B_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb80;
  vector<double,_std::allocator<double>_> *A_values;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *in_stack_fffffffffffffb88;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *in_stack_fffffffffffffb90;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbf8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc00;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *in_stack_fffffffffffffc08;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc30;
  uint in_stack_fffffffffffffc34;
  allocator_type local_318 [48];
  _Base_ptr local_2e8;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_2e0;
  undefined1 local_2d1 [25];
  _Base_ptr local_2b8;
  map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  local_2b0 [2];
  _Base_ptr local_248;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_240;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  local_230;
  _Base_ptr local_218;
  _Base_ptr local_1f8;
  vector<double,_std::allocator<double>_> local_1f0 [3];
  _Base_ptr local_1a8;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_1a0;
  undefined1 local_191 [25];
  _Base_ptr local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  _Base_ptr local_158;
  Timer local_150;
  iterator local_148;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> local_140;
  iterator local_138;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> local_130;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_128;
  size_type local_120;
  vector<double,_std::allocator<double>_> local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  mapped_type local_d8;
  undefined4 local_cc;
  ulong local_c8;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_c0;
  value_type local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  local_90;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  local_70 [2];
  vector<double,_std::allocator<double>_> local_40;
  ulong local_28;
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  *local_20;
  _Base_ptr local_18;
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 3) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Missing argument: Matrix-dimension, Nonzeros/row");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    local_18 = (_Base_ptr)0xa;
    local_10 = in_RSI;
    iVar4 = atoi(*(char **)(in_RSI + 8));
    local_20 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *)(long)iVar4;
    iVar4 = atoi(*(char **)(local_10 + 0x10));
    local_28 = (ulong)iVar4;
    std::allocator<double>::allocator((allocator<double> *)0x102494);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    std::allocator<double>::~allocator((allocator<double> *)0x1024c0);
    std::
    allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>
    ::allocator((allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>
                 *)0x1024e5);
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
              *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (allocator_type *)in_stack_fffffffffffffb60);
    std::
    allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>
    ::~allocator((allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>
                  *)0x102511);
    std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
    ::allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                 *)0x102536);
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::vector(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (allocator_type *)in_stack_fffffffffffffb60);
    std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
    ::~allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                  *)0x102562);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10258a);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb68,(allocator_type *)in_stack_fffffffffffffb60);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1025b6);
    local_b8 = 0;
    for (local_c0 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     *)0x0; vVar2 = local_b8, local_c0 < local_20;
        local_c0 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                    *)((long)&(local_c0->
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1)) {
      for (local_c8 = 0; vVar2 = local_b8, local_c8 < local_28; local_c8 = local_c8 + 1) {
        iVar4 = rand();
        local_cc = (undefined4)((ulong)(long)iVar4 % (ulong)local_20);
        iVar4 = rand();
        dVar11 = (double)iVar4 / 2147483647.0 + 1.0;
        local_d8 = dVar11;
        std::
        vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
        ::operator[](local_70,(size_type)local_c0);
        pmVar6 = std::
                 map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                 ::operator[](in_stack_fffffffffffffb90,(key_type *)in_stack_fffffffffffffb88);
        mVar1 = local_d8;
        *pmVar6 = dVar11;
        std::
        vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
        ::operator[](&local_90,(size_type)local_c0);
        pmVar6 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
                 operator[](in_stack_fffffffffffffb50,(key_type *)in_stack_fffffffffffffb48);
        *pmVar6 = mVar1;
      }
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_b0,(size_type)local_c0);
      *pvVar7 = vVar2;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::operator[](local_70,(size_type)local_c0);
      sVar8 = std::
              map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              ::size((map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                      *)0x10280b);
      local_b8 = local_b8 + (int)sVar8;
    }
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_b0,(size_type)local_20);
    *pvVar7 = vVar2;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x102888);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb68,(allocator_type *)in_stack_fffffffffffffb60);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1028b4);
    std::allocator<double>::allocator((allocator<double> *)0x1028d8);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    std::allocator<double>::~allocator((allocator<double> *)0x102904);
    local_120 = 0;
    for (local_128 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                      *)0x0; local_128 < local_20;
        local_128 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                     *)((long)&(local_128->
                               super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1)) {
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::operator[](local_70,(size_type)local_128);
      local_138._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::begin(in_stack_fffffffffffffb48);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::_Rb_tree_const_iterator
                (&local_130,&local_138);
      while( true ) {
        std::
        vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
        ::operator[](local_70,(size_type)local_128);
        local_148._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
             ::end(in_stack_fffffffffffffb48);
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::
        _Rb_tree_const_iterator(&local_140,&local_148);
        bVar3 = std::operator!=(&local_130,&local_140);
        if (!bVar3) break;
        ppVar9 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                            0x1029d1);
        in_stack_fffffffffffffc34 = ppVar9->first;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_f0,local_120);
        *pvVar7 = in_stack_fffffffffffffc34;
        ppVar9 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                            0x102a05);
        dVar11 = ppVar9->second;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](&local_110,local_120);
        *pvVar10 = dVar11;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                   in_stack_fffffffffffffb50);
        local_120 = local_120 + 1;
      }
    }
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ulong)local_20);
    std::operator<<(poVar5,"    ");
    Timer::Timer(&local_150);
    for (local_158 = (_Base_ptr)0x0; local_158 < local_18;
        local_158 = (_Base_ptr)((long)&local_158->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffc20 = &local_170;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *)0x102b4b);
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                ((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)in_stack_fffffffffffffb90,
                 (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)in_stack_fffffffffffffb88);
      in_stack_fffffffffffffc18 =
           (vector<double,_std::allocator<double>_> *)Timer::get((Timer *)in_stack_fffffffffffffb60)
      ;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_158);
      *pvVar10 = (value_type)in_stack_fffffffffffffc18;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    for (local_178 = (_Base_ptr)0x0; local_178 < local_18;
        local_178 = (_Base_ptr)((long)&local_178->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffc10 = (vector<double,_std::allocator<double>_> *)local_191;
      in_stack_fffffffffffffc08 = local_20;
      std::
      allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>::
      allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                 *)0x102c66);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (allocator_type *)in_stack_fffffffffffffb60);
      std::
      allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>::
      ~allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                  *)0x102c92);
      for (local_1a0 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                        *)0x0; local_1a0 < local_20;
          local_1a0 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                       *)((long)&(local_1a0->
                                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1)) {
        std::
        vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
        ::operator[]((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                      *)(local_191 + 1),(size_type)local_1a0);
        boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::reserve
                  (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      }
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                ((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      in_stack_fffffffffffffc00 =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_178);
      *pvVar10 = (value_type)in_stack_fffffffffffffc00;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    for (local_1a8 = (_Base_ptr)0x0; local_1a8 < local_18;
        local_1a8 = (_Base_ptr)((long)&local_1a8->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x102e0e);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x102e23);
      in_stack_fffffffffffffbf8 = local_1f0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x102e38);
      run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,unsigned_int,double>
                ((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)poVar5,
                 in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      dVar11 = Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_1a8);
      *pvVar10 = dVar11;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    std::operator<<((ostream *)&std::cout,"     ");
    for (local_1f8 = (_Base_ptr)0x0; local_1f8 < local_18;
        local_1f8 = (_Base_ptr)((long)&local_1f8->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *)0x102f83);
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                ((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                  *)in_stack_fffffffffffffb90,
                 (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                  *)in_stack_fffffffffffffb88);
      dVar11 = Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_1f8);
      *pvVar10 = dVar11;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    for (local_218 = (_Base_ptr)0x0; local_218 < local_18;
        local_218 = (_Base_ptr)((long)&local_218->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      std::
      allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>::
      allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                 *)0x103082);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (allocator_type *)in_stack_fffffffffffffb60);
      std::
      allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>::
      ~allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                  *)0x1030ab);
      for (local_240 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                        *)0x0; local_240 < local_20;
          local_240 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                       *)((long)&(local_240->
                                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1)) {
        std::
        vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
        ::operator[](&local_230,(size_type)local_240);
        boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::reserve
                  (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      }
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                ((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                  *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      dVar11 = Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_218);
      *pvVar10 = dVar11;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    for (local_248 = (_Base_ptr)0x0; local_248 < local_18;
        local_248 = (_Base_ptr)((long)&local_248->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10321e);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x103230);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x103242);
      run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,unsigned_int,double>
                ((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)poVar5,
                 in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      dVar11 = Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_248);
      *pvVar10 = dVar11;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    std::operator<<((ostream *)&std::cout,"     ");
    for (local_2b0[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        local_2b0[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left < local_18;
        local_2b0[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             ((long)&(local_2b0[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_color +
             1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb90 = local_2b0;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *)0x10337b);
      run<unsigned_int,double,std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb90,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb88,
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      in_stack_fffffffffffffb88 =
           (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            *)Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,
                           (size_type)
                           local_2b0[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      *pvVar10 = (value_type)in_stack_fffffffffffffb88;
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::~vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    for (local_2b8 = (_Base_ptr)0x0; local_2b8 < local_18;
        local_2b8 = (_Base_ptr)((long)&local_2b8->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      A_values = (vector<double,_std::allocator<double>_> *)local_2d1;
      B_00 = local_20;
      std::
      allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>::
      allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                 *)0x10347e);
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::vector(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (allocator_type *)in_stack_fffffffffffffb60);
      std::
      allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>::
      ~allocator((allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>
                  *)0x1034a4);
      for (local_2e0 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                        *)0x0; local_2e0 < local_20;
          local_2e0 = (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                       *)((long)&(local_2e0->
                                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 1)) {
        std::
        vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
        ::operator[]((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                      *)(local_2d1 + 1),(size_type)local_2e0);
        boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::reserve
                  (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
      }
      run<unsigned_int,double,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb90,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb88,
                 A_values,B_00);
      in_stack_fffffffffffffb70 =
           (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
            *)Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_2b8);
      *pvVar10 = (value_type)in_stack_fffffffffffffb70;
      std::
      vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
      ::~vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    for (local_2e8 = (_Base_ptr)0x0; local_2e8 < local_18;
        local_2e8 = (_Base_ptr)((long)&local_2e8->_M_color + 1)) {
      Timer::start((Timer *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x103627);
      in_stack_fffffffffffffb60 = local_318;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x103639);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x10364b);
      run<unsigned_int,double>
                (in_stack_fffffffffffffc20,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc18,
                 in_stack_fffffffffffffc10,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc08,
                 in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      dVar11 = Timer::get((Timer *)in_stack_fffffffffffffb60);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_40,(size_type)local_2e8);
      *pvVar10 = dVar11;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
    }
    print_median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb60);
    std::
    vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
    ::~vector((vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               *)in_stack_fffffffffffffb60);
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::~vector((vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
               *)in_stack_fffffffffffffb60);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb60);
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 3)
  {
    std::cout << "Missing argument: Matrix-dimension, Nonzeros/row" << std::endl;
    return EXIT_FAILURE;
  }

  std::size_t runs = 10;
  std::size_t N = atoi(argv[1]);
  std::size_t nnz_per_row = atoi(argv[2]);
  std::vector<double> exec_times(runs);

  //
  // Matrix initialization
  //
  std::vector< std::map<unsigned int, double> > A_map(N);
  std::vector< boost::container::flat_map<unsigned int, double> > A_flatmap(N);
  std::vector< unsigned int > A_csr_rows(N+1);

  unsigned int total_nnz = 0;
  for (std::size_t row=0; row<N; ++row)
  {
    for (std::size_t j=0; j<nnz_per_row; ++j)
    {
      unsigned int col_idx = rand() % N;
      double value = 1.0 + double(rand()) / double(RAND_MAX);
      A_map[row][col_idx] = value;
      A_flatmap[row][col_idx] = value;
    }
    A_csr_rows[row] = total_nnz;
    total_nnz += A_map[row].size();
  }
  A_csr_rows[N] = total_nnz;

  std::vector<unsigned int> A_csr_cols(total_nnz);
  std::vector<double> A_csr_values(total_nnz);

  std::size_t index = 0;
  for (std::size_t row=0; row<N; ++row)
    for (std::map<unsigned int, double>::const_iterator it = A_map[row].begin(); it != A_map[row].end(); ++it, ++index)
    {
      A_csr_cols[index] = it->first;
      A_csr_values[index] = it->second;
    }


  //
  // Run benchmarks
  //
  //std::cout << "# Size  map->map  map->flatmap  mat->csr     flatmap->map  flatmap->flatmap  flatmap->csr      csr->map  csr->flatmap  csr->csr" << std::endl;
  std::cout << N << "    ";

  Timer timer;

  // map to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_map, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // map to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_map, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // map to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_map, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << "     ";
  /////////

  // flatmap to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_flatmap, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // flatmap to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_flatmap, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);


  // flatmap to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_flatmap, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << "     ";
  /////////

  // csr to map
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<std::map<unsigned int, double> > B;
    run(A_csr_rows, A_csr_cols, A_csr_values, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  // csr to flatmap
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<boost::container::flat_map<unsigned int, double> > B(N);
    for (std::size_t j=0; j<N; ++j)
      B[j].reserve(2*nnz_per_row);
    run(A_csr_rows, A_csr_cols, A_csr_values, B);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  // csr to csr
  for (std::size_t i=0; i<runs; ++i)
  {
    timer.start();
    std::vector<unsigned int> B_rows;
    std::vector<unsigned int> B_cols;
    std::vector<double> B_values;
    run(A_csr_rows, A_csr_cols, A_csr_values, B_rows, B_cols, B_values);
    exec_times[i] = timer.get();
  }
  print_median(exec_times);

  std::cout << std::endl;

  return EXIT_SUCCESS;
}